

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O2

void __thiscall
Logger<(Log)0>::createMessage<std::__cxx11::string&>
          (Logger<(Log)0> *this,stringstream *msg,char *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  
  poVar3 = (ostream *)(msg + 0x10);
  pcVar4 = fmt + 1;
  bVar2 = false;
  do {
    cVar1 = *fmt;
    do {
      if ((bVar2) || (cVar1 == '%')) {
        std::operator<<(poVar3,(string *)arg);
        for (; *pcVar4 != '\0'; pcVar4 = pcVar4 + 1) {
          std::operator<<(poVar3,*pcVar4);
        }
        return;
      }
      if (cVar1 == '\0') {
        return;
      }
      bVar2 = cVar1 == '\\';
    } while (cVar1 == '\\');
    std::operator<<(poVar3,cVar1);
    fmt = fmt + 1;
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

void createMessage(std::stringstream& msg, const char* fmt, Arg1&& arg)
     {
       bool doSkipNext = false;
       while (*fmt != '%' && !doSkipNext)
       {
         doSkipNext = false;
         if (*fmt == '\0') // End of string
           return;
         
         if (*fmt == '\\')
         { //Escape for the %sign
           doSkipNext = true;
         }
         else 
         { //invoke the replacement
           msg << *fmt;
           fmt++;
         }
       }
       fmt++; //Consume the % sign
       msg << arg;
       while (*fmt != '\0')
       { //And print the end of the message!
         msg << *fmt;
         fmt++;
       }
     }